

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O3

void lws_buflist_describe(lws_buflist **head,void *id,char *reason)

{
  lws_buflist *plVar1;
  uint uVar2;
  
  plVar1 = *head;
  if (plVar1 == (lws_buflist *)0x0) {
    _lws_log(4,"%p: %s: buflist empty\n",id,reason);
    plVar1 = *head;
    if (plVar1 == (lws_buflist *)0x0) {
      return;
    }
  }
  uVar2 = 0;
  do {
    _lws_log(4,"%p: %s: %d: %llu / %llu (%llu left)\n",id,reason,(ulong)uVar2,plVar1->pos,
             plVar1->len,plVar1->len - plVar1->pos);
    head = &((lws_buflist *)head)->next->next;
    plVar1 = ((lws_buflist *)head)->next;
    if (plVar1 == (lws_buflist *)head) {
      _lws_log(1,"%s: next points to self\n","lws_buflist_describe");
      return;
    }
    uVar2 = uVar2 + 1;
  } while (plVar1 != (lws_buflist *)0x0);
  return;
}

Assistant:

void
lws_buflist_describe(struct lws_buflist **head, void *id, const char *reason)
{
	struct lws_buflist *old;
	int n = 0;

	if (*head == NULL)
		lwsl_notice("%p: %s: buflist empty\n", id, reason);

	while (*head) {
		lwsl_notice("%p: %s: %d: %llu / %llu (%llu left)\n", id,
			    reason, n,
			    (unsigned long long)(*head)->pos,
			    (unsigned long long)(*head)->len,
			    (unsigned long long)(*head)->len - (*head)->pos);
		old = *head;
		head = &((*head)->next);
		if (*head == old) {
			lwsl_err("%s: next points to self\n", __func__);
			break;
		}
		n++;
	}
}